

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O3

void SS_mangle(uchar *key,uchar *ret_key,int nbytes)

{
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  
  iVar6 = nbytes + 3;
  if (-1 < nbytes) {
    iVar6 = nbytes;
  }
  uVar7 = 0;
  if (3 < nbytes) {
    uVar8 = 0;
    auVar13 = vpmovsxbq_avx2(ZEXT416(0x18100800));
    do {
      auVar10 = vpshufb_avx(ZEXT416(*(uint *)(key + uVar8 * 4)),SUB6416(ZEXT464(0x10203),0));
      auVar12 = vpmovzxbq_avx2(auVar10);
      auVar12 = vpsllvq_avx2(auVar12,auVar13);
      auVar10 = vpor_avx(auVar12._0_16_,auVar12._16_16_);
      auVar11 = vpshufd_avx(auVar10,0xee);
      vpor_avx(auVar10,auVar11);
      auVar12 = vpbroadcastq_avx512vl();
      auVar12 = vpsrlvq_avx2(auVar12,auVar13);
      auVar10 = vpmovqb_avx512vl(auVar12);
      *(int *)(ret_key + uVar8 * 4) = auVar10._0_4_;
      uVar8 = uVar8 + 1;
    } while ((uint)(iVar6 >> 2) != uVar8);
    uVar7 = (iVar6 >> 2) << 2;
  }
  if (0 < nbytes % 4) {
    auVar13 = vpbroadcastq_avx512vl();
    uVar8 = vpcmpuq_avx512vl(auVar13,_DAT_0010b040,5);
    uVar8 = uVar8 & 0xf;
    auVar10 = vpmovm2d_avx512vl(uVar8);
    auVar10 = vpshufd_avx(auVar10,0x1b);
    uVar9 = vpmovd2m_avx512vl(auVar10);
    auVar10 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(key + ((ulong)(nbytes % 4 + uVar7) - 4)));
    auVar11[1] = ((byte)(uVar9 >> 1) & 1) * auVar10[1];
    auVar11[0] = ((byte)uVar9 & 1) * auVar10[0];
    auVar11[2] = ((byte)(uVar9 >> 2) & 1) * auVar10[2];
    auVar11[3] = ((byte)(uVar9 >> 3) & 1) * auVar10[3];
    auVar11[4] = ((byte)(uVar9 >> 4) & 1) * auVar10[4];
    auVar11[5] = ((byte)(uVar9 >> 5) & 1) * auVar10[5];
    auVar11[6] = ((byte)(uVar9 >> 6) & 1) * auVar10[6];
    auVar11[7] = ((byte)(uVar9 >> 7) & 1) * auVar10[7];
    auVar11[8] = ((byte)(uVar9 >> 8) & 1) * auVar10[8];
    auVar11[9] = ((byte)(uVar9 >> 9) & 1) * auVar10[9];
    auVar11[10] = ((byte)(uVar9 >> 10) & 1) * auVar10[10];
    auVar11[0xb] = ((byte)(uVar9 >> 0xb) & 1) * auVar10[0xb];
    auVar11[0xc] = ((byte)(uVar9 >> 0xc) & 1) * auVar10[0xc];
    auVar11[0xd] = ((byte)(uVar9 >> 0xd) & 1) * auVar10[0xd];
    auVar11[0xe] = ((byte)(uVar9 >> 0xe) & 1) * auVar10[0xe];
    auVar11[0xf] = ((byte)(uVar9 >> 0xf) & 1) * auVar10[0xf];
    auVar10 = vpshufb_avx(auVar11,_DAT_0010b300);
    auVar12 = vpmovzxbq_avx2(auVar10);
    auVar13 = vpmovsxbq_avx2(ZEXT416(0x18100800));
    auVar12 = vpsllvq_avx512vl(auVar12,auVar13);
    auVar10._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar12._8_8_;
    auVar10._0_8_ = (ulong)((byte)uVar8 & 1) * auVar12._0_8_;
    auVar14._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * auVar12._16_8_;
    auVar14._0_16_ = auVar10;
    auVar14._24_8_ = (uVar8 >> 3) * auVar12._24_8_;
    auVar10 = vpor_avx(auVar10,auVar14._16_16_);
    auVar11 = vpshufd_avx(auVar10,0xee);
    vpor_avx(auVar10,auVar11);
    auVar12 = vpbroadcastq_avx512vl();
    auVar13 = vpsrlvq_avx2(auVar12,auVar13);
    auVar10 = vpmovqb_avx512vl(auVar13);
    uVar1 = *(undefined4 *)(ret_key + uVar7);
    bVar2 = (bool)((byte)uVar8 & 1);
    bVar3 = (bool)((byte)(uVar8 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar8 >> 2) & 1);
    bVar5 = SUB81(uVar8 >> 3,0);
    *(uint *)(ret_key + uVar7) =
         CONCAT13(bVar5 * auVar10[3] | !bVar5 * (char)((uint)uVar1 >> 0x18),
                  CONCAT12(bVar4 * auVar10[2] | !bVar4 * (char)((uint)uVar1 >> 0x10),
                           CONCAT11(bVar3 * auVar10[1] | !bVar3 * (char)((uint)uVar1 >> 8),
                                    bVar2 * auVar10[0] | !bVar2 * (char)uVar1)));
  }
  return;
}

Assistant:

void SS_mangle(const unsigned char* key, unsigned char* ret_key,
	int nbytes) {
	int i, j;
	unsigned long long new_key;
	for (j = 0; j < nbytes / 4; ++j) {
		new_key = 0;
		for (i = 0; i < 4; ++i) {
			uint64_t tmp = 0;
			tmp = key[4 - i - 1 + j * 4];
			new_key |= tmp << (i * 8);
		}
		new_key = (new_key * 2083697005) & (0xffffffffffffffff);
		for (i = 0; i < 4; ++i) {
			ret_key[i + 4 * j] = (new_key >> (i * 8)) & 0xff;
		}
	}

	int remain = nbytes % 4;
	new_key = 0;
	for (i = 0; i < remain; ++i) {
		uint64_t tmp = 0;
		tmp = key[remain - i - 1 + j * 4];
		new_key |= tmp << (i * 8);
	}
	new_key = (new_key * 2083697005) & (0xffffffffffffffff);
	for (i = 0; i < remain; ++i) {
		ret_key[i + 4 * j] = (new_key >> (i * 8)) & 0xff;
	}
}